

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O2

char display_pickinv(char *lets,boolean want_reply,long *out_cnt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  nh_objitem *items;
  nh_objresult *pick_list;
  obj **obj;
  char *__s;
  char cVar7;
  long lVar8;
  int icount;
  char titlebuf [128];
  
  icount = 0;
  obj = &invent;
  if (invent == (obj *)0x0) {
    if (lets != (char *)0x0 || want_reply != '\0') {
      pline("Not carrying anything.");
      return '\0';
    }
  }
  else if ((lets != (char *)0x0) && (sVar6 = strlen(lets), sVar6 == 1)) {
    do {
      obj = &((obj *)obj)->nobj->nobj;
      if ((obj *)obj == (obj *)0x0) {
        return '\0';
      }
    } while (((obj *)obj)->invlet != *lets);
    xprname((obj *)obj,(char *)0x0,((obj *)obj)->invlet,'\x01',0,0);
    pline("%s",xprname::li);
    if (out_cnt != (long *)0x0) {
      *out_cnt = -1;
      return '\0';
    }
    return '\0';
  }
  items = make_invlist(lets,&icount);
  iVar5 = icount;
  lVar8 = (long)icount;
  if (lVar8 == 0) {
    pick_list = (nh_objresult *)0x0;
    cVar7 = '\0';
  }
  else {
    if (want_reply == '\0') {
      iVar1 = weight_cap();
      iVar2 = inv_weight();
      uVar3 = weight_cap();
      uVar4 = inv_cnt();
      __s = titlebuf;
      snprintf(__s,0x80,"Inventory: %d/%dwt (%d of 52 slots)",(ulong)(uint)(iVar1 + iVar2),
               (ulong)uVar3,(ulong)uVar4);
      iVar1 = -1;
    }
    else {
      iVar1 = 1;
      __s = (char *)0x0;
    }
    pick_list = (nh_objresult *)malloc(lVar8 << 3);
    iVar5 = display_objects(items,iVar5,__s,iVar1,pick_list);
    if (iVar5 < 1) {
      cVar7 = '\x1b';
      if (iVar5 == 0) {
        cVar7 = '\0';
      }
    }
    else {
      cVar7 = (char)pick_list->id;
      if (out_cnt != (long *)0x0) {
        *out_cnt = (long)pick_list->count;
      }
    }
  }
  free(pick_list);
  free(items);
  return cVar7;
}

Assistant:

static char display_pickinv(const char *lets, boolean want_reply, long *out_cnt)
{
	struct obj *otmp;
	char ret;
	int n = 0;
	int icount = 0;
	struct nh_objitem *items;
	struct nh_objresult *selected = NULL;

	/*
	Exit early if no inventory -- but keep going if we are doing
	a permanent inventory update.  We need to keep going so the
	permanent inventory window updates itself to remove the last
	item(s) dropped.  One down side:  the addition of the exception
	for permanent inventory window updates _can_ pop the window
	up when it's not displayed -- even if it's empty -- because we
	don't know at this level if its up or not.  This may not be
	an issue if empty checks are done before hand and the call
	to here is short circuited away.
	*/
	if (!invent && !(!lets && !want_reply)) {
	    pline("Not carrying anything.");
	    return 0;
	}

	if (lets && strlen(lets) == 1) {
	    /* when only one item of interest, use pline instead of menus */
	    ret = '\0';
	    for (otmp = invent; otmp; otmp = otmp->nobj) {
		if (otmp->invlet == lets[0]) {
		    pline("%s", xprname(otmp, NULL, lets[0], TRUE, 0L, 0L));
		    if (out_cnt) *out_cnt = -1L;	/* select all */
		    break;
		}
	    }
	    return ret;
	}

	items = make_invlist(lets, &icount);

	if (icount) {
	    char *title;
	    char titlebuf[QBUFSZ];
	    if (want_reply) {
		title = NULL;
	    } else {
		snprintf(titlebuf, QBUFSZ, "Inventory: %d/%dwt (%d of 52 slots)",
			 weight_cap() + inv_weight(), weight_cap(), inv_cnt());
		title = titlebuf;
	    }
	    selected = malloc(icount * sizeof(struct nh_objresult));
	    n = display_objects(items, icount, title,
				want_reply ? PICK_ONE : PICK_INVACTION, selected);
	}
	if (n > 0) {
	    ret = (char)selected[0].id;
	    if (out_cnt)
		*out_cnt = selected[0].count;
	} else
	    ret = !n ? '\0' : '\033';	/* cancelled */
	    
	free(selected);
	free(items);
	return ret;
}